

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O2

void __thiscall
MIDISong2::MIDISong2(MIDISong2 *this,MIDISong2 *original,char *filename,EMidiDevice type)

{
  int iVar1;
  BYTE *__src;
  ulong uVar2;
  TrackInfo *pTVar3;
  BYTE *__dest;
  TrackInfo *pTVar4;
  ulong uVar5;
  ulong uVar6;
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,filename,type);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__MIDISong2_006ea6d8;
  iVar1 = original->SongLen;
  this->SongLen = iVar1;
  __dest = (BYTE *)operator_new__((long)iVar1);
  this->MusHeader = __dest;
  __src = original->MusHeader;
  memcpy(__dest,__src,(long)iVar1);
  uVar2._0_4_ = original->NumTracks;
  uVar2._4_4_ = original->Format;
  this->NumTracks = (undefined4)uVar2;
  this->Format = uVar2._4_4_;
  this->DesignationMask = 0;
  (this->super_MIDIStreamer).Division = (original->super_MIDIStreamer).Division;
  iVar1 = (original->super_MIDIStreamer).InitialTempo;
  (this->super_MIDIStreamer).InitialTempo = iVar1;
  (this->super_MIDIStreamer).Tempo = iVar1;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (int)(undefined4)uVar2) {
    uVar6 = (long)(int)(undefined4)uVar2 << 6;
  }
  pTVar4 = (TrackInfo *)operator_new__(uVar6);
  this->Tracks = pTVar4;
  uVar5 = 0;
  uVar6 = uVar2 & 0xffffffff;
  if ((int)(undefined4)uVar2 < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 * 0x40 != uVar5; uVar5 = uVar5 + 0x40) {
    pTVar3 = original->Tracks;
    *(BYTE **)((long)&pTVar4->TrackBegin + uVar5) =
         __dest + (*(long *)((long)&pTVar3->TrackBegin + uVar5) - (long)__src);
    *(undefined8 *)((long)&pTVar4->TrackP + uVar5) = 0;
    *(undefined8 *)((long)&pTVar4->MaxTrackP + uVar5) =
         *(undefined8 *)((long)&pTVar3->MaxTrackP + uVar5);
  }
  return;
}

Assistant:

MIDISong2::MIDISong2(const MIDISong2 *original, const char *filename, EMidiDevice type)
: MIDIStreamer(filename, type)
{
	SongLen = original->SongLen;
	MusHeader = new BYTE[original->SongLen];
	memcpy(MusHeader, original->MusHeader, original->SongLen);
	Format = original->Format;
	NumTracks = original->NumTracks;
	DesignationMask = 0;
	Division = original->Division;
	Tempo = InitialTempo = original->InitialTempo;
	Tracks = new TrackInfo[NumTracks];
	for (int i = 0; i < NumTracks; ++i)
	{
		TrackInfo *newtrack = &Tracks[i];
		const TrackInfo *oldtrack = &original->Tracks[i];

		newtrack->TrackBegin = MusHeader + (oldtrack->TrackBegin - original->MusHeader);
		newtrack->TrackP = 0;
		newtrack->MaxTrackP = oldtrack->MaxTrackP;
	}
}